

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_ptime.c
# Opt level: O1

uint fmt_ptime2(char *s,taia *ta,char sep)

{
  ulong uVar1;
  tm *ptVar2;
  uint uVar3;
  time_t u;
  long local_30;
  
  uVar1 = (ta->sec).x;
  uVar3 = 0;
  if (0x4000000000000009 < uVar1) {
    local_30 = uVar1 + 0xbffffffffffffff6;
    ptVar2 = gmtime(&local_30);
    uVar3 = 0;
    if (ptVar2 != (tm *)0x0) {
      fmt_ulong(s,(long)ptVar2->tm_year + 0x76c);
      s[4] = '-';
      fmt_uint0(s + 5,ptVar2->tm_mon + 1,2);
      s[7] = '-';
      fmt_uint0(s + 8,ptVar2->tm_mday,2);
      s[10] = sep;
      fmt_uint0(s + 0xb,ptVar2->tm_hour,2);
      s[0xd] = ':';
      fmt_uint0(s + 0xe,ptVar2->tm_min,2);
      s[0x10] = ':';
      fmt_uint0(s + 0x11,ptVar2->tm_sec,2);
      s[0x13] = '.';
      fmt_uint0(s + 0x14,(uint)ta->nano,9);
      uVar3 = 0x19;
    }
  }
  return uVar3;
}

Assistant:

unsigned int fmt_ptime2(char *s, struct taia *ta, char sep) {
  struct tm *t;
  time_t u;

  if (ta->sec.x < 4611686018427387914ULL) return(0); /* impossible? */
  u =ta->sec.x -4611686018427387914ULL;
  if (! (t =gmtime((time_t*)&u))) return(0);
  fmt_ulong(s, 1900 +t->tm_year);
  s[4] ='-'; fmt_uint0(&s[5], t->tm_mon +1, 2);
  s[7] ='-'; fmt_uint0(&s[8], t->tm_mday, 2);
  s[10] =sep; fmt_uint0(&s[11], t->tm_hour, 2);
  s[13] =':'; fmt_uint0(&s[14], t->tm_min, 2);
  s[16] =':'; fmt_uint0(&s[17], t->tm_sec, 2);
  s[19] ='.'; fmt_uint0(&s[20], ta->nano, 9);
  return(25);
}